

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.hpp
# Opt level: O2

void __thiscall
Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::~PipelineStateBase
          (PipelineStateBase<Diligent::EngineGLImplTraits> *this)

{
  _Alloc_hider _Var1;
  string msg;
  string local_38;
  
  (this->
  super_DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
  ).super_ObjectBase<Diligent::IPipelineStateGL>.super_RefCountedObject<Diligent::IPipelineStateGL>.
  super_IPipelineStateGL.super_IPipelineState.super_IDeviceObject.super_IObject =
       (IObject)&PTR_QueryInterface_00a56628;
  AsyncInitializer::GetAsyncTask((AsyncInitializer *)&local_38,&this->m_AsyncInitializer);
  _Var1._M_p = local_38._M_dataplus._M_p;
  RefCntAutoPtr<Diligent::IAsyncTask>::Release((RefCntAutoPtr<Diligent::IAsyncTask> *)&local_38);
  if (_Var1._M_p != (Char *)0x0) {
    FormatString<char[128]>
              (&local_38,
               (char (*) [128])
               "Initialize task is still running. This may result in a crash if the task accesses resources owned by the pipeline state object."
              );
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"~PipelineStateBase",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x1af);
    std::__cxx11::string::~string((string *)&local_38);
  }
  if (this->m_IsDestructed == false) {
    FormatString<char[58]>
              (&local_38,(char (*) [58])"This object must be explicitly destructed with Destruct()")
    ;
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"~PipelineStateBase",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x1c2);
    std::__cxx11::string::~string((string *)&local_38);
  }
  std::unique_ptr<Diligent::AsyncInitializer,_std::default_delete<Diligent::AsyncInitializer>_>::
  ~unique_ptr(&this->m_AsyncInitializer);
  DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
  ::~DeviceObjectBase(&this->
                       super_DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
                     );
  return;
}

Assistant:

~PipelineStateBase()
    {
        VERIFY(!AsyncInitializer::GetAsyncTask(m_AsyncInitializer), "Initialize task is still running. This may result in a crash if the task accesses resources owned by the pipeline state object.");

        /*
        /// \note Destructor cannot directly remove the object from the registry as this may cause a
        ///       deadlock at the point where StateObjectsRegistry::Find() locks the weak pointer: if we
        ///       are in dtor, the object is locked by Diligent::RefCountedObject::Release() and
        ///       StateObjectsRegistry::Find() will wait for that lock to be released.
        ///       A the same time this thread will be waiting for the other thread to unlock the registry.\n
        ///       Thus destructor only notifies the registry that there is a deleted object.
        ///       The reference to the object will be removed later.
        auto &PipelineStateRegistry = static_cast<TRenderDeviceBase*>(this->GetDevice())->GetBSRegistry();
        auto &RasterizerStateRegistry = static_cast<TRenderDeviceBase*>(this->GetDevice())->GetRSRegistry();
        auto &DSSRegistry = static_cast<TRenderDeviceBase*>(this->GetDevice())->GetDSSRegistry();
        // StateObjectsRegistry::ReportDeletedObject() does not lock the registry, but only
        // atomically increments the outstanding deleted objects counter.
        PipelineStateRegistry.ReportDeletedObject();
        RasterizerStateRegistry.ReportDeletedObject();
        DSSRegistry.ReportDeletedObject();
        */
        VERIFY(m_IsDestructed, "This object must be explicitly destructed with Destruct()");
    }